

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlNsPtr xmlNewNs(xmlNodePtr node,xmlChar *href,xmlChar *prefix)

{
  _xmlNs *p_Var1;
  int iVar2;
  xmlNsPtr pxVar3;
  xmlChar *pxVar4;
  xmlNs *pxVar5;
  
  if (((node == (xmlNodePtr)0x0) || (node->type == XML_ELEMENT_NODE)) &&
     ((prefix == (xmlChar *)0x0 ||
      ((iVar2 = xmlStrEqual(prefix,"xml"), iVar2 == 0 ||
       (iVar2 = xmlStrEqual(href,(xmlChar *)"http://www.w3.org/XML/1998/namespace"), iVar2 == 0)))))
     ) {
    pxVar3 = (xmlNsPtr)(*xmlMalloc)(0x30);
    if (pxVar3 == (xmlNsPtr)0x0) {
      __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,"building namespace");
      return (xmlNsPtr)0x0;
    }
    pxVar3->next = (_xmlNs *)0x0;
    *(undefined8 *)&pxVar3->type = 0;
    pxVar3->_private = (void *)0x0;
    pxVar3->context = (_xmlDoc *)0x0;
    pxVar3->href = (xmlChar *)0x0;
    pxVar3->prefix = (xmlChar *)0x0;
    pxVar3->type = XML_NAMESPACE_DECL;
    if (href != (xmlChar *)0x0) {
      pxVar4 = xmlStrdup(href);
      pxVar3->href = pxVar4;
    }
    if (prefix != (xmlChar *)0x0) {
      pxVar4 = xmlStrdup(prefix);
      pxVar3->prefix = pxVar4;
    }
    if (node == (xmlNodePtr)0x0) {
      return pxVar3;
    }
    pxVar5 = node->nsDef;
    if (pxVar5 == (xmlNs *)0x0) {
      node->nsDef = pxVar3;
      return pxVar3;
    }
    if (pxVar5->prefix != (xmlChar *)0x0 || pxVar3->prefix != (xmlChar *)0x0) {
      iVar2 = xmlStrEqual(pxVar5->prefix,pxVar3->prefix);
      while (iVar2 == 0) {
        p_Var1 = pxVar5->next;
        if (p_Var1 == (_xmlNs *)0x0) {
          pxVar5->next = pxVar3;
          return pxVar3;
        }
        if (p_Var1->prefix == (xmlChar *)0x0 && pxVar3->prefix == (xmlChar *)0x0) break;
        iVar2 = xmlStrEqual(p_Var1->prefix,pxVar3->prefix);
        pxVar5 = p_Var1;
      }
    }
    if (pxVar3->href != (xmlChar *)0x0) {
      (*xmlFree)(pxVar3->href);
    }
    if (pxVar3->prefix != (xmlChar *)0x0) {
      (*xmlFree)(pxVar3->prefix);
    }
    (*xmlFree)(pxVar3);
  }
  return (xmlNsPtr)0x0;
}

Assistant:

xmlNsPtr
xmlNewNs(xmlNodePtr node, const xmlChar *href, const xmlChar *prefix) {
    xmlNsPtr cur;

    if ((node != NULL) && (node->type != XML_ELEMENT_NODE))
	return(NULL);

    if ((prefix != NULL) && (xmlStrEqual(prefix, BAD_CAST "xml"))) {
        /* xml namespace is predefined, no need to add it */
        if (xmlStrEqual(href, XML_XML_NAMESPACE))
            return(NULL);

        /*
         * Problem, this is an attempt to bind xml prefix to a wrong
         * namespace, which breaks
         * Namespace constraint: Reserved Prefixes and Namespace Names
         * from XML namespace. But documents authors may not care in
         * their context so let's proceed.
         */
    }

    /*
     * Allocate a new Namespace and fill the fields.
     */
    cur = (xmlNsPtr) xmlMalloc(sizeof(xmlNs));
    if (cur == NULL) {
	xmlTreeErrMemory("building namespace");
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlNs));
    cur->type = XML_LOCAL_NAMESPACE;

    if (href != NULL)
	cur->href = xmlStrdup(href);
    if (prefix != NULL)
	cur->prefix = xmlStrdup(prefix);

    /*
     * Add it at the end to preserve parsing order ...
     * and checks for existing use of the prefix
     */
    if (node != NULL) {
	if (node->nsDef == NULL) {
	    node->nsDef = cur;
	} else {
	    xmlNsPtr prev = node->nsDef;

	    if (((prev->prefix == NULL) && (cur->prefix == NULL)) ||
		(xmlStrEqual(prev->prefix, cur->prefix))) {
		xmlFreeNs(cur);
		return(NULL);
	    }
	    while (prev->next != NULL) {
	        prev = prev->next;
		if (((prev->prefix == NULL) && (cur->prefix == NULL)) ||
		    (xmlStrEqual(prev->prefix, cur->prefix))) {
		    xmlFreeNs(cur);
		    return(NULL);
		}
	    }
	    prev->next = cur;
	}
    }
    return(cur);
}